

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O2

void __thiscall GrpParser::tableJust(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *this_01;
  RefAST RVar1;
  bool bVar2;
  uint uVar3;
  int el;
  NoViableAltException *pNVar4;
  RefAST *this_02;
  RefAST tmp48_AST;
  RefAST tmp50_AST;
  RefAST tmp49_AST;
  RefCount<AST> local_a0;
  RefCount<Token> local_98;
  ASTFactory local_90;
  RefCount<Token> local_80;
  RefCount<Token> local_78;
  RefAST tmp47_AST;
  ASTPair currentAST;
  RefAST local_58;
  RefToken local_50;
  RefToken local_48;
  RefAST local_40;
  RefAST local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  local_a0.ref = nullAST.ref;
  currentAST.root.ref = (Ref *)0x0;
  currentAST.child.ref = (Ref *)0x0;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 2;
  }
  tmp47_AST.ref = local_a0.ref;
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_78,this,1);
  this_01 = &(this->super_LLkParser).super_Parser.astFactory;
  ASTFactory::create((ASTFactory *)&tmp48_AST,(RefToken *)this_01);
  RefCount<AST>::operator=(&tmp47_AST,&tmp48_AST);
  RefCount<AST>::~RefCount(&tmp48_AST);
  RefCount<Token>::~RefCount(&local_78);
  Parser::match((Parser *)this,6);
  tmp48_AST = nullAST;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_80,this,1);
  ASTFactory::create((ASTFactory *)&tmp49_AST,(RefToken *)this_01);
  RefCount<AST>::operator=(&tmp48_AST,&tmp49_AST);
  RefCount<AST>::~RefCount(&tmp49_AST);
  RefCount<Token>::~RefCount(&local_80);
  if (tmp48_AST.ref != (Ref *)0x0) {
    (tmp48_AST.ref)->count = (tmp48_AST.ref)->count + 1;
  }
  local_38.ref = tmp48_AST.ref;
  ASTFactory::addASTChild(this_01,&currentAST,&local_38);
  RefCount<AST>::~RefCount(&local_38);
  Parser::match((Parser *)this,0x38);
  tmp49_AST = nullAST;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_90.nodeFactory,this,1);
  ASTFactory::create((ASTFactory *)&tmp50_AST,(RefToken *)this_01);
  RefCount<AST>::operator=(&tmp49_AST,&tmp50_AST);
  RefCount<AST>::~RefCount(&tmp50_AST);
  RefCount<Token>::~RefCount((RefCount<Token> *)&local_90.nodeFactory);
  Parser::match((Parser *)this,7);
  uVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (uVar3 < 0x36) {
    if ((0x2d0140fc00e340U >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
      if ((ulong)uVar3 != 0xb) goto LAB_00166bd0;
      directives(this);
      local_40.ref = this_00->ref;
      if (local_40.ref != (Ref *)0x0) {
        (local_40.ref)->count = (local_40.ref)->count + 1;
      }
      ASTFactory::addASTChild(this_01,&currentAST,&local_40);
      RefCount<AST>::~RefCount(&local_40);
    }
    uVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    RVar1 = nullAST;
    if (uVar3 < 0x36) {
      if ((0x2d0140fc00e240U >> ((ulong)uVar3 & 0x3f) & 1) != 0) goto LAB_00166d40;
      if ((ulong)uVar3 == 8) {
        if (nullAST.ref != (Ref *)0x0) {
          (nullAST.ref)->count = (nullAST.ref)->count + 1;
        }
        tmp50_AST = RVar1;
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_98,this,1);
        ASTFactory::create(&local_90,(RefToken *)this_01);
        RefCount<AST>::operator=(&tmp50_AST,(RefCount<AST> *)&local_90);
        RefCount<AST>::~RefCount((RefCount<AST> *)&local_90);
        RefCount<Token>::~RefCount(&local_98);
        Parser::match((Parser *)this,8);
        this_02 = &tmp50_AST;
        while( true ) {
          RefCount<AST>::~RefCount(this_02);
LAB_00166d40:
          el = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
          bVar2 = BitSet::member(&_tokenSet_12,el);
          if (!bVar2) break;
          subEntry(this);
          local_58.ref = this_00->ref;
          if (local_58.ref != (Ref *)0x0) {
            (local_58.ref)->count = (local_58.ref)->count + 1;
          }
          ASTFactory::addASTChild(this_01,&currentAST,&local_58);
          this_02 = &local_58;
        }
        RefCount<AST>::operator=(&local_a0,&currentAST.root);
        RefCount<AST>::~RefCount(&tmp49_AST);
        RefCount<AST>::~RefCount(&tmp48_AST);
        RefCount<AST>::~RefCount(&tmp47_AST);
        RefCount<AST>::operator=(this_00,&local_a0);
        RefCount<AST>::~RefCount(&local_a0);
        ASTPair::~ASTPair(&currentAST);
        return;
      }
    }
    pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_50,this,1);
    NoViableAltException::NoViableAltException(pNVar4,&local_50);
    __cxa_throw(pNVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
  }
LAB_00166bd0:
  pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_48,this,1);
  NoViableAltException::NoViableAltException(pNVar4,&local_48);
  __cxa_throw(pNVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
}

Assistant:

void GrpParser::tableJust() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST tableJust_AST = nullAST;
	
	try {      // for error handling
		RefAST tmp47_AST = nullAST;
		tmp47_AST = astFactory.create(LT(1));
		match(OP_LPAREN);
		RefAST tmp48_AST = nullAST;
		tmp48_AST = astFactory.create(LT(1));
		astFactory.addASTChild(currentAST, tmp48_AST);
		match(LITERAL_justification);
		RefAST tmp49_AST = nullAST;
		tmp49_AST = astFactory.create(LT(1));
		match(OP_RPAREN);
		{
		switch ( LA(1)) {
		case OP_LBRACE:
		{
			directives();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case OP_LPAREN:
		case OP_SEMI:
		case LITERAL_environment:
		case IDENT:
		case LITERAL_table:
		case LITERAL_endtable:
		case LITERAL_pseudo:
		case LIT_UHEX:
		case LITERAL_codepoint:
		case LITERAL_glyphid:
		case LITERAL_postscript:
		case LITERAL_unicode:
		case LITERAL_pass:
		case LITERAL_if:
		case OP_LBRACKET:
		case OP_UNDER:
		case OP_AT:
		case OP_HASH:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		{
		switch ( LA(1)) {
		case OP_SEMI:
		{
			RefAST tmp50_AST = nullAST;
			tmp50_AST = astFactory.create(LT(1));
			match(OP_SEMI);
			break;
		}
		case OP_LPAREN:
		case LITERAL_environment:
		case IDENT:
		case LITERAL_table:
		case LITERAL_endtable:
		case LITERAL_pseudo:
		case LIT_UHEX:
		case LITERAL_codepoint:
		case LITERAL_glyphid:
		case LITERAL_postscript:
		case LITERAL_unicode:
		case LITERAL_pass:
		case LITERAL_if:
		case OP_LBRACKET:
		case OP_UNDER:
		case OP_AT:
		case OP_HASH:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		{
		do {
			if ((_tokenSet_12.member(LA(1)))) {
				subEntry();
				astFactory.addASTChild(currentAST, returnAST);
			}
			else {
				goto _loop269;
			}
			
		} while (true);
		_loop269:;
		}
		tableJust_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_11);
	}
	returnAST = tableJust_AST;
}